

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

void __thiscall iDynTree::SensorsList::destructor(SensorsList *this)

{
  void *pvVar1;
  reference pvVar2;
  size_type sVar3;
  reference ppSVar4;
  long in_RDI;
  size_t sensor_index;
  int sensor_type;
  SensorsListPimpl *in_stack_ffffffffffffffd0;
  ulong in_stack_ffffffffffffffe8;
  ulong uVar5;
  undefined4 in_stack_fffffffffffffff0;
  int iVar6;
  
  for (iVar6 = 0; iVar6 < 5; iVar6 = iVar6 + 1) {
    uVar5 = 0;
    while( true ) {
      in_stack_ffffffffffffffe8 = uVar5;
      pvVar2 = std::
               vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               ::operator[](*(vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                              **)(in_RDI + 8),(long)iVar6);
      sVar3 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::size(pvVar2);
      if (sVar3 <= uVar5) break;
      pvVar2 = std::
               vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               ::operator[](*(vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                              **)(in_RDI + 8),(long)iVar6);
      ppSVar4 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator[]
                          (pvVar2,in_stack_ffffffffffffffe8);
      in_stack_ffffffffffffffd0 = (SensorsListPimpl *)*ppSVar4;
      if (in_stack_ffffffffffffffd0 != (SensorsListPimpl *)0x0) {
        (*(code *)(((in_stack_ffffffffffffffd0->allSensors).
                    super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish)();
      }
      uVar5 = in_stack_ffffffffffffffe8 + 1;
    }
  }
  std::
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ::resize((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
            *)CONCAT44(iVar6,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ::resize((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
            *)CONCAT44(iVar6,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  pvVar1 = *(void **)(in_RDI + 8);
  if (pvVar1 != (void *)0x0) {
    SensorsListPimpl::~SensorsListPimpl(in_stack_ffffffffffffffd0);
    operator_delete(pvVar1,0x30);
  }
  *(undefined8 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

void SensorsList::destructor()
{
    for( int sensor_type = 0; sensor_type < NR_OF_SENSOR_TYPES; sensor_type++ )
    {
        for(size_t sensor_index = 0;
            sensor_index < this->pimpl->allSensors[sensor_type].size(); sensor_index++ )
        {
            delete this->pimpl->allSensors[sensor_type][sensor_index];
        }
    }
    this->pimpl->allSensors.resize(0);
    this->pimpl->sensorsNameToIndex.resize(0);

    delete this->pimpl;
    this->pimpl = 0;
}